

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PClass * __thiscall ClassReg::RegisterClass(ClassReg *this)

{
  PClass *pPVar1;
  PClass *cls;
  ClassReg *this_local;
  
  if (this->MyClass == (PClass *)0x0) {
    if (0xb < *(uint *)&this->field_0x28 >> 0x1c) {
      __assert_fail("0 && \"Class registry has an invalid meta class identifier\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0xbca,"PClass *ClassReg::RegisterClass()");
    }
    if (RegisterClass::metaclasses[*(uint *)&this->field_0x28 >> 0x1c]->MyClass == (PClass *)0x0) {
      RegisterClass(RegisterClass::metaclasses[*(uint *)&this->field_0x28 >> 0x1c]);
    }
    this_local = (ClassReg *)
                 PClass::CreateNew(RegisterClass::metaclasses[*(uint *)&this->field_0x28 >> 0x1c]->
                                   MyClass);
    SetupClass(this,(PClass *)this_local);
    PClass::InsertIntoHash((PClass *)this_local);
    if (this->ParentType != (ClassReg *)0x0) {
      pPVar1 = RegisterClass(this->ParentType);
      ((PClass *)this_local)->ParentClass = pPVar1;
    }
  }
  else {
    this_local = (ClassReg *)this->MyClass;
  }
  return (PClass *)this_local;
}

Assistant:

PClass *ClassReg::RegisterClass()
{
	static ClassReg *const metaclasses[] =
	{
		&PClass::RegistrationInfo,
		&PClassActor::RegistrationInfo,
		&PClassInventory::RegistrationInfo,
		&PClassAmmo::RegistrationInfo,
		&PClassHealth::RegistrationInfo,
		&PClassPuzzleItem::RegistrationInfo,
		&PClassWeapon::RegistrationInfo,
		&PClassPlayerPawn::RegistrationInfo,
		&PClassType::RegistrationInfo,
		&PClassClass::RegistrationInfo,
		&PClassWeaponPiece::RegistrationInfo,
		&PClassPowerupGiver::RegistrationInfo,
	};

	// Skip classes that have already been registered
	if (MyClass != NULL)
	{
		return MyClass;
	}

	// Add type to list
	PClass *cls;

	if (MetaClassNum >= countof(metaclasses))
	{
		assert(0 && "Class registry has an invalid meta class identifier");
	}

	if (metaclasses[MetaClassNum]->MyClass == NULL)
	{ // Make sure the meta class is already registered before registering this one
		metaclasses[MetaClassNum]->RegisterClass();
	}
	cls = static_cast<PClass *>(metaclasses[MetaClassNum]->MyClass->CreateNew());

	SetupClass(cls);
	cls->InsertIntoHash();
	if (ParentType != NULL)
	{
		cls->ParentClass = ParentType->RegisterClass();
	}
	return cls;
}